

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O0

Stream * rw::d3d9::readNativeData
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  Material **ppMVar1;
  FILE *pFVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  char *pcVar6;
  undefined4 *puVar7;
  InstanceData *pIVar8;
  void *pvVar9;
  uint16 *puVar10;
  ulong *puVar11;
  uint8 *puVar12;
  uint local_114;
  uint32 i_2;
  uint8 *verts;
  int i_1;
  VertexStream *s;
  uint16 *indices;
  uint32 numDeclarations;
  VertexElement elements [12];
  uint local_7c;
  uint32 matid;
  uint32 i;
  InstanceData *inst;
  uint8 *p;
  uint8 *data;
  int32 size;
  InstanceDataHeader *header;
  undefined4 local_48;
  Error _e_1;
  Error _e;
  uint32 platform;
  Geometry *geometry;
  int32 param_4_local;
  int32 param_3_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  bVar3 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar3) {
    uVar4 = Stream::readU32(stream);
    if (uVar4 == 9) {
      puVar7 = (undefined4 *)
               mustmalloc_LOC(0x70,0x3000f,
                              "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp line: 164"
                             );
      *(undefined4 **)((long)object + 0x98) = puVar7;
      *puVar7 = 9;
      uVar5 = Stream::readI32(stream);
      pIVar8 = (InstanceData *)
               mustmalloc_LOC((long)(int)uVar5,0x1000f,
                              "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp line: 169"
                             );
      (*stream->_vptr_Stream[4])(stream,pIVar8,(ulong)uVar5);
      puVar7[1] = pIVar8->numIndex;
      puVar7[2] = pIVar8->minVert;
      *(undefined8 *)(puVar7 + 4) = 0;
      puVar7[6] = *(undefined4 *)((long)&pIVar8->material + 4);
      puVar7[0x14] = pIVar8[1].numIndex;
      *(undefined8 *)(puVar7 + 0x16) = 0;
      puVar7[0x18] = *(undefined4 *)&pIVar8[1].material;
      puVar7[0x19] = *(undefined4 *)((long)&pIVar8[1].material + 4);
      inst = (InstanceData *)&pIVar8[1].vertexAlpha;
      pvVar9 = mustmalloc_LOC((ulong)(uint)puVar7[2] * 0x30,0x3000f,
                              "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp line: 181"
                             );
      *(void **)(puVar7 + 0x1a) = pvVar9;
      _matid = *(uint32 **)(puVar7 + 0x1a);
      for (local_7c = 0; local_7c < (uint)puVar7[2]; local_7c = local_7c + 1) {
        *_matid = inst->numIndex;
        _matid[1] = inst->minVert;
        *(undefined8 *)(_matid + 2) =
             *(undefined8 *)(*(long *)((long)object + 0x80) + (ulong)*(uint *)&inst->material * 8);
        _matid[4] = *(uint32 *)((long)&inst->material + 4);
        _matid[6] = 0;
        _matid[7] = 0;
        _matid[8] = 0;
        _matid[9] = *(uint32 *)&inst->vertexShader;
        _matid[10] = *(uint32 *)((long)&inst->vertexShader + 4);
        _matid[0xb] = inst->baseIndex;
        inst = (InstanceData *)&inst->numVertices;
        _matid = _matid + 0xc;
      }
      uVar4 = Stream::readU32(stream);
      (*stream->_vptr_Stream[4])(stream,&stack0xffffffffffffff18,(ulong)(uVar4 << 3));
      pvVar9 = createVertexDeclaration((VertexElement *)&stack0xffffffffffffff18);
      *(void **)(puVar7 + 0x16) = pvVar9;
      pvVar9 = d3d::createIndexBuffer(puVar7[0x18] << 1,false);
      *(void **)(puVar7 + 4) = pvVar9;
      puVar10 = d3d::lockIndices(*(void **)(puVar7 + 4),0,0,0);
      (*stream->_vptr_Stream[4])(stream,puVar10,(ulong)(uint)(puVar7[0x18] << 1));
      d3d::unlockIndices(*(void **)(puVar7 + 4));
      inst = pIVar8;
      for (verts._4_4_ = 0; verts._4_4_ < 2; verts._4_4_ = verts._4_4_ + 1) {
        (*stream->_vptr_Stream[4])(stream,inst,0x10);
        puVar11 = (ulong *)(puVar7 + (long)verts._4_4_ * 6 + 8);
        *puVar11 = (ulong)inst->numIndex;
        *(undefined4 *)(puVar11 + 1) = 0;
        *(undefined4 *)((long)puVar11 + 0xc) = *(undefined4 *)&inst->material;
        *(undefined2 *)(puVar11 + 2) = *(undefined2 *)((long)&inst->material + 4);
        ppMVar1 = &inst->material;
        *(undefined1 *)((long)puVar11 + 0x12) = *(undefined1 *)((long)&inst->material + 6);
        inst = (InstanceData *)&inst->vertexAlpha;
        *(undefined1 *)((long)puVar11 + 0x13) = *(undefined1 *)((long)ppMVar1 + 7);
        if (*puVar11 != 0) {
          pvVar9 = d3d::createVertexBuffer(*(int *)((long)puVar11 + 0xc) * puVar7[0x19],0,false);
          *puVar11 = (ulong)pvVar9;
          puVar12 = d3d::lockVertices((void *)*puVar11,0,0,0);
          (*stream->_vptr_Stream[4])
                    (stream,puVar12,(ulong)(uint)(*(int *)((long)puVar11 + 0xc) * puVar7[0x19]));
          d3d::unlockVertices((void *)*puVar11);
        }
      }
      _matid = *(uint32 **)(puVar7 + 0x1a);
      for (local_114 = 0; local_114 < (uint)puVar7[2]; local_114 = local_114 + 1) {
        *(uint *)((long)_matid + 0x20) =
             *(int *)((long)_matid + 4) + (uint)puVar7[10] / (uint)puVar7[0xb];
        _matid = (uint32 *)((long)_matid + 0x30);
      }
      (*DAT_00168638)(pIVar8);
      stream_local = stream;
    }
    else {
      header._4_4_ = 2;
      local_48 = 0x80000006;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp"
              ,0xa1);
      pFVar2 = _stderr;
      pcVar6 = dbgsprint(0x80000006,(ulong)uVar4);
      fprintf(pFVar2,"%s\n",pcVar6);
      setError((Error *)((long)&header + 4));
      stream_local = (Stream *)0x0;
    }
  }
  else {
    _e_1.plugin = 2;
    _e_1.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d9.cpp"
            ,0x9c);
    pFVar2 = _stderr;
    pcVar6 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar2,"%s\n",pcVar6);
    setError(&_e_1);
    stream_local = (Stream *)0x0;
  }
  return stream_local;
}

Assistant:

Stream*
readNativeData(Stream *stream, int32, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_D3D9){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geometry->instData = header;
	header->platform = PLATFORM_D3D9;

	int32 size = stream->readI32();
	uint8 *data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_GEOMETRY);
	stream->read8(data, size);
	uint8 *p = data;
	header->serialNumber = *(uint32*)p; p += 4;
	header->numMeshes = *(uint32*)p; p += 4;
	header->indexBuffer = nil; p += 4;
	header->primType = *(uint32*)p; p += 4;
	p += 16*2;	// skip vertex streams, they're repeated with the vertex buffers
	header->useOffsets = *(bool32*)p; p += 4;
	header->vertexDeclaration = nil; p += 4;
	header->totalNumIndex = *(uint32*)p; p += 4;
	header->totalNumVertex = *(uint32*)p; p += 4;
	header->inst = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);

	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		inst->numIndex = *(uint32*)p; p += 4;
		inst->minVert = *(uint32*)p; p += 4;
		uint32 matid = *(uint32*)p; p += 4;
		inst->material = geometry->matList.materials[matid];
		inst->vertexAlpha = *(bool32*)p; p += 4;
		inst->vertexShader = nil; p += 4;
		inst->baseIndex = 0; p += 4;
		inst->numVertices = *(uint32*)p; p += 4;
		inst->startIndex = *(uint32*)p; p += 4;
		inst->numPrimitives = *(uint32*)p; p += 4;
		inst++;
	}

	VertexElement elements[NUMDECLELT];
	uint32 numDeclarations = stream->readU32();
	stream->read8(elements, numDeclarations*8);
	header->vertexDeclaration = createVertexDeclaration(elements);

	assert(header->indexBuffer == nil);
	header->indexBuffer = createIndexBuffer(header->totalNumIndex*2, false);
	uint16 *indices = lockIndices(header->indexBuffer, 0, 0, 0);
	stream->read8(indices, 2*header->totalNumIndex);
	unlockIndices(header->indexBuffer);

	VertexStream *s;
	p = data;
	for(int i = 0; i < 2; i++){
		stream->read8(p, 16);
		s = &header->vertexStream[i];
		s->vertexBuffer = (void*)(uintptr)*(uint32*)p; p += 4;
		s->offset = 0; p += 4;
		s->stride = *(uint32*)p; p += 4;
		s->geometryFlags = *(uint16*)p; p += 2;
		s->managed = *p++;
		s->dynamicLock = *p++;

		if(s->vertexBuffer == nil)
			continue;
		// TODO: use dynamic VB when doing morphing
		assert(s->vertexBuffer == nil);
		s->vertexBuffer = createVertexBuffer(s->stride*header->totalNumVertex, 0, false);
		uint8 *verts = lockVertices(s->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
		stream->read8(verts, s->stride*header->totalNumVertex);
		unlockVertices(s->vertexBuffer);
	}

	// TODO: somehow depends on number of streams used (baseIndex = minVert when more than one)
	inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		inst->baseIndex = inst->minVert + header->vertexStream[0].offset / header->vertexStream[0].stride;
		inst++;
	}

	rwFree(data);
	return stream;
}